

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

QString * __thiscall
VcprojGenerator::extraCompilerName
          (VcprojGenerator *this,ProString *extraCompiler,QStringList *inputs,QStringList *outputs)

{
  bool bVar1;
  undefined8 in_RCX;
  QMakeProject *in_RSI;
  ProString *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  QString *name;
  ProString *this_00;
  QChar sep;
  undefined1 local_80 [54];
  QChar local_4a;
  QStringBuilder<const_ProString_&,_const_char_(&)[6]> local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->m_string).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->m_string).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->m_string).d.size = -0x5555555555555556;
  sep.ucs = (char16_t)((ulong)(in_RSI->super_QMakeEvaluator).m_superfile.d.size >> 0x30);
  this_00 = in_RDI;
  local_48 = ::operator+((ProString *)in_RSI,(char (*) [6])in_RDI);
  ProKey::ProKey<ProString_const&,char_const(&)[6]>
            ((ProKey *)in_RSI,(QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)this_00);
  QMakeProject::values(in_RSI,(ProKey *)this_00);
  QChar::QChar<char,_true>(&local_4a,' ');
  ProStringList::join((ProStringList *)this_00,sep);
  ProKey::~ProKey((ProKey *)0x299dcf);
  bVar1 = QString::isEmpty((QString *)0x299dd9);
  if (bVar1) {
    ProString::toQString(this_00);
    QString::operator=((QString *)in_RSI,&this_00->m_string);
    QString::~QString((QString *)0x299e07);
  }
  else {
    (*(code *)(((in_RSI->super_QMakeEvaluator).m_caller)->m_extraConfigs).super_QList<ProString>.d.d
    )(local_80,in_RSI,in_RDI,in_RCX,in_R8,0);
    QString::operator=((QString *)in_RSI,&this_00->m_string);
    QString::~QString((QString *)0x299e44);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &this_00->m_string;
}

Assistant:

QString VcprojGenerator::extraCompilerName(const ProString &extraCompiler,
                                             const QStringList &inputs,
                                             const QStringList &outputs)
{
    QString name = project->values(ProKey(extraCompiler + ".name")).join(' ');
    if (name.isEmpty())
        name = extraCompiler.toQString();
    else
        name = replaceExtraCompilerVariables(name, inputs, outputs, NoShell);
    return name;
}